

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

type fmt::v5::
     visit_format_arg<fmt::v5::internal::arg_converter<long_long,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (arg_converter<long_long,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *vis,basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     *arg)

{
  char cVar1;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pbVar2;
  uint uVar3;
  ulong uVar4;
  assertion_failure *this;
  type tVar5;
  
  switch(arg->type_) {
  case named_arg_type:
    this = (assertion_failure *)__cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure(this,"invalid argument type");
    __cxa_throw(this,&assertion_failure::typeinfo,std::logic_error::~logic_error);
  case int_type:
    uVar3 = (arg->value_).field_0.int_value;
    uVar4 = (ulong)(int)uVar3;
    if ((vis->type_ != 'i') && (vis->type_ != 'd')) goto LAB_001361c6;
LAB_001361bc:
    tVar5 = long_long_type;
    break;
  case uint_type:
    uVar4 = (ulong)(arg->value_).field_0.uint_value;
    tVar5 = (vis->type_ == 'd' || vis->type_ == 'i') + uint_type;
    break;
  case long_long_type:
  case ulong_long_type:
    uVar4 = (arg->value_).field_0.long_long_value;
    tVar5 = (vis->type_ == 'd' || vis->type_ == 'i') ^ ulong_long_type;
    break;
  case bool_type:
    cVar1 = vis->type_;
    if (cVar1 == 's') {
      return;
    }
    uVar4 = (ulong)((arg->value_).field_0.int_value != 0);
    tVar5 = long_long_type;
    if (cVar1 != 'i') {
      tVar5 = (cVar1 != 'd') + 4 + (uint)(cVar1 != 'd');
    }
    break;
  case char_type:
    uVar3 = (arg->value_).field_0.uint_value;
    if ((vis->type_ == 'i') || (vis->type_ == 'd')) {
      uVar4 = (ulong)(char)uVar3;
      goto LAB_001361bc;
    }
    uVar3 = uVar3 & 0xff;
LAB_001361c6:
    uVar4 = (ulong)uVar3;
    tVar5 = uint_type;
    break;
  default:
    goto switchD_00136131_default;
  }
  pbVar2 = vis->arg_;
  *(ulong *)&(pbVar2->value_).field_0 = uVar4;
  pbVar2->type_ = tVar5;
switchD_00136131_default:
  return;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}